

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InterpreterThunkEmitter.cpp
# Opt level: O0

void __thiscall InterpreterThunkEmitter::Close(InterpreterThunkEmitter *this)

{
  ArenaAllocator *pAVar1;
  Type_conflict pSVar2;
  bool bVar3;
  Type_conflict *ppSVar4;
  SListBase<ThunkBlock,_Memory::ArenaAllocator,_RealCount> *pSVar5;
  long *plVar6;
  long extraout_RDX;
  long extraout_RDX_00;
  code *local_c0;
  code *local_a0;
  anon_class_1_0_00000001 unregisterPdata;
  InterpreterThunkEmitter *this_local;
  FreeFuncType freeFunc_1;
  NodeBase *next_1;
  NodeBase *current_1;
  FreeFuncType freeFunc;
  NodeBase *next;
  NodeBase *current;
  
  SListBase<ThunkBlock,Memory::ArenaAllocator,RealCount>::
  Iterate<InterpreterThunkEmitter::Close()::__0>
            ((SListBase<ThunkBlock,Memory::ArenaAllocator,RealCount> *)&this->thunkBlocks);
  SListBase<ThunkBlock,Memory::ArenaAllocator,RealCount>::
  Iterate<InterpreterThunkEmitter::Close()::__0>
            ((SListBase<ThunkBlock,Memory::ArenaAllocator,RealCount> *)&this->freeListedThunkBlocks)
  ;
  pSVar5 = &this->thunkBlocks;
  pAVar1 = this->allocator;
  ppSVar4 = SListNodeBase<Memory::ArenaAllocator>::Next
                      (&pSVar5->super_SListNodeBase<Memory::ArenaAllocator>);
  next = *ppSVar4;
  while (bVar3 = SListBase<ThunkBlock,_Memory::ArenaAllocator,_RealCount>::IsHead(pSVar5,next),
        ((bVar3 ^ 0xffU) & 1) != 0) {
    ppSVar4 = SListNodeBase<Memory::ArenaAllocator>::Next(next);
    pSVar2 = *ppSVar4;
    local_a0 = (code *)Memory::TypeAllocatorFunc<Memory::ArenaAllocator,_ThunkBlock>::GetFreeFunc();
    plVar6 = (long *)((long)&(pAVar1->
                             super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>
                             ).super_Allocator.outOfMemoryFunc + extraout_RDX);
    if (((ulong)local_a0 & 1) != 0) {
      local_a0 = *(code **)(local_a0 + *plVar6 + -1);
    }
    (*local_a0)(plVar6,next,0x28);
    next = pSVar2;
  }
  SListBase<ThunkBlock,_Memory::ArenaAllocator,_RealCount>::Reset(pSVar5);
  pSVar5 = &this->freeListedThunkBlocks;
  pAVar1 = this->allocator;
  ppSVar4 = SListNodeBase<Memory::ArenaAllocator>::Next
                      (&pSVar5->super_SListNodeBase<Memory::ArenaAllocator>);
  next_1 = *ppSVar4;
  while (bVar3 = SListBase<ThunkBlock,_Memory::ArenaAllocator,_RealCount>::IsHead(pSVar5,next_1),
        ((bVar3 ^ 0xffU) & 1) != 0) {
    ppSVar4 = SListNodeBase<Memory::ArenaAllocator>::Next(next_1);
    pSVar2 = *ppSVar4;
    local_c0 = (code *)Memory::TypeAllocatorFunc<Memory::ArenaAllocator,_ThunkBlock>::GetFreeFunc();
    plVar6 = (long *)((long)&(pAVar1->
                             super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>
                             ).super_Allocator.outOfMemoryFunc + extraout_RDX_00);
    if (((ulong)local_c0 & 1) != 0) {
      local_c0 = *(code **)(local_c0 + *plVar6 + -1);
    }
    (*local_c0)(plVar6,next_1,0x28);
    next_1 = pSVar2;
  }
  SListBase<ThunkBlock,_Memory::ArenaAllocator,_RealCount>::Reset(pSVar5);
  EmitBufferManager<Memory::VirtualAllocWrapper,_Memory::PreReservedVirtualAllocWrapper,_FakeCriticalSection>
  ::Decommit(&this->emitBufferManager);
  this->thunkBuffer = (BYTE *)0x0;
  this->thunkCount = 0;
  return;
}

Assistant:

void InterpreterThunkEmitter::Close()
{
#if PDATA_ENABLED
    auto unregisterPdata = ([&] (const ThunkBlock& block)
    {
        PDataManager::UnregisterPdata((PRUNTIME_FUNCTION) block.GetPdata());
    });
    thunkBlocks.Iterate(unregisterPdata);
    freeListedThunkBlocks.Iterate(unregisterPdata);
#endif

    this->thunkBlocks.Clear(allocator);
    this->freeListedThunkBlocks.Clear(allocator);

#ifdef ENABLE_OOP_NATIVE_CODEGEN
    if (JITManager::GetJITManager()->IsOOPJITEnabled())
    {
        PSCRIPTCONTEXT_HANDLE remoteScript = this->scriptContext->GetRemoteScriptAddr(false);
        if (remoteScript && JITManager::GetJITManager()->IsConnected())
        {
            JITManager::GetJITManager()->DecommitInterpreterBufferManager(remoteScript, this->isAsmInterpreterThunk);
        }
    }
    else
#endif
    {
        emitBufferManager.Decommit();
    }


    this->thunkBuffer = nullptr;
    this->thunkCount = 0;
}